

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coll.cpp
# Opt level: O0

void icu_63::initAvailableLocaleList(UErrorCode *status)

{
  undefined1 auVar1 [16];
  UBool UVar2;
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  long lVar6;
  char *size;
  UMemory *this;
  Locale *local_240;
  Locale *local_218;
  Locale local_210;
  char *local_130;
  char *tempKey;
  undefined1 local_111;
  Locale *local_110;
  Locale *local_108;
  undefined1 local_f9;
  UMemory *local_f8;
  ulong *local_f0;
  int local_e4;
  undefined1 local_e0 [4];
  int32_t i;
  UResourceBundle installed;
  UResourceBundle *index;
  UErrorCode *status_local;
  
  installed.fSize = 0;
  installed._196_4_ = 0;
  local_e4 = 0;
  ures_initStackObject_63((UResourceBundle *)local_e0);
  installed._192_8_ = ures_openDirect_63("icudt63l-coll","res_index",status);
  size = "InstalledLocales";
  ures_getByKey_63((UResourceBundle *)installed._192_8_,"InstalledLocales",
                   (UResourceBundle *)local_e0,status);
  UVar2 = ::U_SUCCESS(*status);
  if (UVar2 != '\0') {
    ::availableLocaleListCount = ures_getSize_63((UResourceBundle *)local_e0);
    uVar3 = (ulong)::availableLocaleListCount;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar3;
    uVar4 = SUB168(auVar1 * ZEXT816(0xe0),0);
    this = (UMemory *)(uVar4 + 8);
    if (SUB168(auVar1 * ZEXT816(0xe0),8) != 0 || 0xfffffffffffffff7 < uVar4) {
      this = (UMemory *)0xffffffffffffffff;
    }
    puVar5 = (ulong *)UMemory::operator_new__(this,(size_t)size);
    local_f9 = 0;
    local_111 = 0;
    local_218 = (Locale *)0x0;
    if (puVar5 != (ulong *)0x0) {
      local_f9 = 1;
      *puVar5 = uVar3;
      local_218 = (Locale *)(puVar5 + 1);
      local_f8 = this;
      local_f0 = puVar5;
      if (uVar3 != 0) {
        local_240 = local_218;
        do {
          local_110 = local_240;
          local_111 = 1;
          local_108 = local_218;
          Locale::Locale(local_240);
          local_240 = local_240 + 1;
        } while (local_240 != local_218 + uVar3);
      }
    }
    ::availableLocaleList = local_218;
    if (local_218 != (Locale *)0x0) {
      ures_resetIterator_63((UResourceBundle *)local_e0);
      while (UVar2 = ures_hasNext_63((UResourceBundle *)local_e0), UVar2 != '\0') {
        local_130 = (char *)0x0;
        ures_getNextString_63((UResourceBundle *)local_e0,(int32_t *)0x0,&local_130,status);
        Locale::Locale(&local_210,local_130,(char *)0x0,(char *)0x0,(char *)0x0);
        lVar6 = (long)local_e4;
        local_e4 = local_e4 + 1;
        Locale::operator=(::availableLocaleList + lVar6,&local_210);
        Locale::~Locale(&local_210);
      }
    }
    ures_close_63((UResourceBundle *)local_e0);
  }
  ures_close_63((UResourceBundle *)installed._192_8_);
  ucln_i18n_registerCleanup_63(UCLN_I18N_COLLATOR,collator_cleanup);
  return;
}

Assistant:

static void U_CALLCONV 
initAvailableLocaleList(UErrorCode &status) {
    U_ASSERT(availableLocaleListCount == 0);
    U_ASSERT(availableLocaleList == NULL);
    // for now, there is a hardcoded list, so just walk through that list and set it up.
    UResourceBundle *index = NULL;
    UResourceBundle installed;
    int32_t i = 0;
    
    ures_initStackObject(&installed);
    index = ures_openDirect(U_ICUDATA_COLL, "res_index", &status);
    ures_getByKey(index, "InstalledLocales", &installed, &status);
    
    if(U_SUCCESS(status)) {
        availableLocaleListCount = ures_getSize(&installed);
        availableLocaleList = new Locale[availableLocaleListCount];
        
        if (availableLocaleList != NULL) {
            ures_resetIterator(&installed);
            while(ures_hasNext(&installed)) {
                const char *tempKey = NULL;
                ures_getNextString(&installed, NULL, &tempKey, &status);
                availableLocaleList[i++] = Locale(tempKey);
            }
        }
        U_ASSERT(availableLocaleListCount == i);
        ures_close(&installed);
    }
    ures_close(index);
    ucln_i18n_registerCleanup(UCLN_I18N_COLLATOR, collator_cleanup);
}